

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O0

void __thiscall bal::Cnf::transaction_begin(Cnf *this)

{
  Cnf *this_local;
  
  if (this->immutable_offset_ == 0) {
    this->immutable_offset_ = (this->clauses_).size_;
    ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
    ::transaction_begin((ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
                         *)&this->l0_index_);
    return;
  }
  __assert_fail("immutable_offset_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.cpp"
                ,0x4b,"void bal::Cnf::transaction_begin()");
}

Assistant:

void Cnf::transaction_begin() {
        assert(immutable_offset_ == 0);
        immutable_offset_ = clauses_.size_;
        l0_index_.transaction_begin();
    }